

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  Extension *pEVar1;
  RepeatedField<int> *pRVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = desc;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar1->is_repeated = true;
    pEVar1->type = field_type;
    pEVar1->is_packed = packed;
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)field_type * 4)) {
    case 1:
    case 8:
      pRVar2 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<int>>(this->arena_);
      break;
    case 2:
      pRVar2 = (RepeatedField<int> *)
               Arena::CreateMessageInternal<google::protobuf::RepeatedField<long>>(this->arena_);
      break;
    case 3:
      pRVar2 = (RepeatedField<int> *)
               Arena::CreateMessageInternal<google::protobuf::RepeatedField<unsigned_int>>
                         (this->arena_);
      break;
    case 4:
      pRVar2 = (RepeatedField<int> *)
               Arena::CreateMessageInternal<google::protobuf::RepeatedField<unsigned_long>>
                         (this->arena_);
      break;
    case 5:
      pRVar2 = (RepeatedField<int> *)
               Arena::CreateMessageInternal<google::protobuf::RepeatedField<double>>(this->arena_);
      break;
    case 6:
      pRVar2 = (RepeatedField<int> *)
               Arena::CreateMessageInternal<google::protobuf::RepeatedField<float>>(this->arena_);
      break;
    case 7:
      pRVar2 = (RepeatedField<int> *)
               Arena::CreateMessageInternal<google::protobuf::RepeatedField<bool>>(this->arena_);
      break;
    case 9:
      pRVar2 = (RepeatedField<int> *)
               Arena::
               CreateMessageInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                         (this->arena_);
      break;
    case 10:
      pRVar2 = (RepeatedField<int> *)
               Arena::
               CreateMessageInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                         (this->arena_);
      break;
    default:
      goto switchD_003d4f21_default;
    }
    (pEVar1->field_0).repeated_message_value =
         (RepeatedPtrField<google::protobuf::MessageLite> *)pRVar2;
  }
switchD_003d4f21_default:
  return (void *)(pEVar1->field_0).int64_t_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->type = field_type;
    extension->is_packed = packed;

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->repeated_int32_t_value =
            Arena::CreateMessage<RepeatedField<int32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->repeated_int64_t_value =
            Arena::CreateMessage<RepeatedField<int64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->repeated_uint32_t_value =
            Arena::CreateMessage<RepeatedField<uint32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->repeated_uint64_t_value =
            Arena::CreateMessage<RepeatedField<uint64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->repeated_double_value =
            Arena::CreateMessage<RepeatedField<double>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->repeated_float_value =
            Arena::CreateMessage<RepeatedField<float>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->repeated_bool_value =
            Arena::CreateMessage<RepeatedField<bool>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->repeated_enum_value =
            Arena::CreateMessage<RepeatedField<int>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->repeated_string_value =
            Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->repeated_message_value =
            Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->repeated_int32_t_value;
}